

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O1

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  int iVar1;
  jpeg_c_prep_controller *pjVar2;
  JDIMENSION JVar3;
  int iVar4;
  jpeg_c_prep_controller *pjVar5;
  JSAMPARRAY ppJVar6;
  uint uVar7;
  int iVar8;
  jpeg_component_info *pjVar9;
  int row;
  uint uVar10;
  int iVar11;
  int row_1;
  long lVar12;
  long local_70;
  
  uVar7 = *in_row_ctr;
  if (uVar7 < in_rows_avail) {
    pjVar5 = cinfo->prep;
    do {
      if (out_row_groups_avail <= *out_row_group_ctr) {
        return;
      }
      JVar3 = *(JDIMENSION *)((long)&pjVar5[6].start_pass + 4);
      uVar10 = cinfo->max_v_samp_factor - JVar3;
      if (in_rows_avail - uVar7 <= uVar10) {
        uVar10 = in_rows_avail - uVar7;
      }
      (*cinfo->cconvert->color_convert)
                (cinfo,input_buf + uVar7,(JSAMPIMAGE)(pjVar5 + 1),JVar3,uVar10);
      *in_row_ctr = *in_row_ctr + uVar10;
      iVar8 = *(int *)((long)&pjVar5[6].start_pass + 4) + uVar10;
      *(int *)((long)&pjVar5[6].start_pass + 4) = iVar8;
      pjVar2 = pjVar5 + 6;
      *(uint *)&pjVar2->start_pass = *(int *)&pjVar2->start_pass - uVar10;
      if ((*(int *)&pjVar2->start_pass == 0) && (iVar8 < cinfo->max_v_samp_factor)) {
        if (0 < cinfo->num_components) {
          lVar12 = 0;
          do {
            iVar8 = cinfo->max_v_samp_factor;
            iVar11 = *(int *)((long)&pjVar5[6].start_pass + 4);
            if (iVar11 < iVar8) {
              ppJVar6 = (JSAMPARRAY)(&pjVar5[1].start_pass)[lVar12];
              JVar3 = cinfo->image_width;
              iVar1 = iVar11 + -1;
              do {
                jcopy_sample_rows(ppJVar6,iVar1,ppJVar6,iVar11,1,JVar3);
                iVar11 = iVar11 + 1;
              } while (iVar8 != iVar11);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < cinfo->num_components);
        }
        *(int *)((long)&pjVar5[6].start_pass + 4) = cinfo->max_v_samp_factor;
      }
      if (*(int *)((long)&pjVar5[6].start_pass + 4) == cinfo->max_v_samp_factor) {
        (*cinfo->downsample->downsample)
                  (cinfo,(JSAMPIMAGE)(pjVar5 + 1),0,output_buf,*out_row_group_ctr);
        *(undefined4 *)((long)&pjVar5[6].start_pass + 4) = 0;
        *out_row_group_ctr = *out_row_group_ctr + 1;
      }
      if ((*(int *)&pjVar5[6].start_pass == 0) && (*out_row_group_ctr < out_row_groups_avail)) {
        if (0 < cinfo->num_components) {
          pjVar9 = cinfo->comp_info;
          local_70 = 0;
          do {
            iVar8 = (pjVar9->DCT_v_scaled_size * pjVar9->v_samp_factor) /
                    cinfo->min_DCT_v_scaled_size;
            iVar11 = *out_row_group_ctr * iVar8;
            if (iVar11 < (int)(iVar8 * out_row_groups_avail)) {
              iVar4 = pjVar9->DCT_h_scaled_size;
              ppJVar6 = output_buf[local_70];
              JVar3 = pjVar9->width_in_blocks;
              iVar1 = iVar11 + -1;
              iVar8 = iVar8 * (out_row_groups_avail - *out_row_group_ctr);
              do {
                jcopy_sample_rows(ppJVar6,iVar1,ppJVar6,iVar11,1,iVar4 * JVar3);
                iVar11 = iVar11 + 1;
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
            local_70 = local_70 + 1;
            pjVar9 = pjVar9 + 1;
          } while (local_70 < cinfo->num_components);
        }
        *out_row_group_ctr = out_row_groups_avail;
        return;
      }
      uVar7 = *in_row_ctr;
    } while (uVar7 < in_rows_avail);
  }
  return;
}

Assistant:

METHODDEF(void)
pre_process_data (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		  JDIMENSION in_rows_avail,
		  JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		  JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info * compptr;

  while (*in_row_ctr < in_rows_avail &&
	 *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int) MIN((JDIMENSION) numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
				       prep->color_buf,
				       (JDIMENSION) prep->next_buf_row,
				       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
	prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
	expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			   prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf, (JDIMENSION) 0,
					output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 &&
	*out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	   ci++, compptr++) {
	numrows = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
	expand_bottom_edge(output_buf[ci],
			   compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			   (int) (*out_row_group_ctr * numrows),
			   (int) (out_row_groups_avail * numrows));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;			/* can exit outer loop without test */
    }
  }
}